

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::dht_log_alert::message_abi_cxx11_(string *__return_storage_ptr__,dht_log_alert *this)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char ret [900];
  char acStack_3a8 [912];
  
  iVar1 = *(int *)(_ZZNK10libtorrent13dht_log_alert7messageB5cxx11EvE11dht_modules_rel +
                  (ulong)this->module * 4);
  pcVar2 = aux::stack_allocator::ptr
                     ((this->m_alloc)._M_data,(allocation_slot)(this->m_msg_idx).m_idx);
  snprintf(acStack_3a8,900,"DHT %s: %s",
           _ZZNK10libtorrent13dht_log_alert7messageB5cxx11EvE11dht_modules_rel + iVar1,pcVar2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(acStack_3a8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_3a8,acStack_3a8 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_log_alert::message() const
	{
		static char const* const dht_modules[] =
		{
			"tracker",
			"node",
			"routing_table",
			"rpc_manager",
			"traversal"
		};

		char ret[900];
		std::snprintf(ret, sizeof(ret), "DHT %s: %s", dht_modules[module]
			, log_message());
		return ret;
	}